

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uidgid.c
# Opt level: O0

uint uidgids_set(uidgid *u,char *ug)

{
  char *pcVar1;
  uint uVar2;
  int local_2c;
  unsigned_long uStack_28;
  int i;
  unsigned_long id;
  char *ug_local;
  uidgid *u_local;
  
  id = (unsigned_long)ug;
  ug_local = (char *)u;
  uVar2 = scan_ulong(ug,&stack0xffffffffffffffd8);
  if (*(char *)(id + uVar2) == ':') {
    *(int *)ug_local = (int)uStack_28;
    id = (unsigned_long)(id + uVar2);
    for (local_2c = 0; id = id + 1, local_2c < 0x3c; local_2c = local_2c + 1) {
      uVar2 = scan_ulong((char *)id,&stack0xffffffffffffffd8);
      id = id + uVar2;
      *(int *)(ug_local + (long)local_2c * 4 + 4) = (int)uStack_28;
      if (*(char *)id != ':') {
        local_2c = local_2c + 1;
        break;
      }
    }
    pcVar1 = ug_local + (long)local_2c * 4 + 4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(int *)(ug_local + 0xf8) = local_2c;
    if (*(char *)id == '\0') {
      u_local._4_4_ = 1;
    }
    else {
      u_local._4_4_ = 0;
    }
  }
  else {
    u_local._4_4_ = 0;
  }
  return u_local._4_4_;
}

Assistant:

unsigned int uidgids_set(struct uidgid *u, char *ug) {
  unsigned long id;
  int i;

  if (*(ug +=scan_ulong(ug, &id)) != ':') return(0);
  u->uid =(uid_t)id;
  ++ug;
  for (i =0; i < 60; ++i, ++ug) {
    ug +=scan_ulong(ug, &id);
    u->gid[i] =(gid_t)id;
    if (*ug != ':') { ++i; break; }
  }
  u->gid[i] =0;
  u->gids =i;
  if (*ug) return(0);
  return(1);
}